

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::OptimizeLinkDependencies
          (cmComputeTargetDepends *this,cmGeneratorTarget *gt,cmGraphEdgeList *outputEdges,
          cmGraphEdgeList *inputEdges)

{
  bool bVar1;
  int iVar2;
  pointer pTVar3;
  int iVar4;
  undefined8 uVar5;
  mapped_type_conflict *pmVar6;
  size_type sVar7;
  _Rb_tree_node_base *p_Var8;
  const_iterator cVar9;
  uint *puVar10;
  _Base_ptr p_Var11;
  mapped_type_conflict index_1;
  mapped_type_conflict index;
  cmGeneratorTarget *dep;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  uint local_124;
  value_type *local_120;
  uint local_114;
  pointer local_110;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *local_108;
  key_type local_100;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  *local_f8;
  cmGraphEdge local_f0;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_d8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_c8;
  cmGeneratorTarget *local_b8;
  cmComputeTargetDepends *local_b0;
  pointer local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *local_a0;
  _Rb_tree_node_base *local_98;
  undefined1 local_90 [5];
  bool local_8b;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  _Rb_tree_node_base *local_78;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8 = (inputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_120 = (inputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
              super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_108 = &outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  local_b8 = gt;
  local_b0 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; local_120 != local_a8; local_120 = local_120 + 1) {
    if (local_120->Strong == true) {
      std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back(local_108,local_120);
    }
    else {
      iVar2 = local_120->Dest;
      pTVar3 = (local_b0->SideEffects).
               super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_110 = pTVar3 + iVar2;
      local_f8 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)&local_120->Backtrace;
      for (p_Var8 = *(_Base_ptr *)
                     ((long)&pTVar3[iVar2].CustomCommandSideEffects._M_t._M_impl + 0x18);
          p_Var8 != (_Rb_tree_node_base *)
                    ((long)&pTVar3[iVar2].CustomCommandSideEffects._M_t._M_impl + 8U);
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        local_f0.Dest = p_Var8[1]._M_color;
        local_f0.Strong = (bool)p_Var8[1].field_0x4;
        local_f0.Cross = (bool)p_Var8[1].field_0x5;
        local_f0._6_2_ = *(undefined2 *)&p_Var8[1].field_0x6;
        pmVar6 = std::
                 map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                 ::operator[](&this->TargetIndex,(key_type *)&local_f0);
        local_100 = (key_type)CONCAT44(local_100._4_4_,*pmVar6);
        sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,
                           (key_type_conflict *)&local_100);
        if (sVar7 == 0) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,(int *)&local_100);
          iVar4 = (int)local_100;
          local_114 = CONCAT31(local_114._1_3_,local_120->Cross);
          std::
          __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_c8,local_f8);
          local_90._0_4_ = iVar4;
          local_90[4] = false;
          local_8b = (bool)(undefined1)local_114;
          local_88 = local_c8._M_ptr;
          _Stack_80._M_pi = local_c8._M_refcount._M_pi;
          local_c8._M_ptr = (element_type *)0x0;
          local_c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
                    (local_108,(cmGraphEdge *)local_90);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
        }
      }
      cmGeneratorTarget::GetAllConfigCompileLanguages_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90,local_b8);
      local_a0 = &local_110->LanguageSideEffects;
      local_110 = (pointer)((long)&(local_110->LanguageSideEffects)._M_t._M_impl + 8);
      p_Var8 = local_78;
      while (p_Var8 != (_Rb_tree_node_base *)&local_88) {
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                ::find(&local_a0->_M_t,(key_type *)(p_Var8 + 1));
        local_98 = p_Var8;
        if ((pointer)cVar9._M_node != local_110) {
          for (p_Var11 = cVar9._M_node[2]._M_right;
              p_Var11 != (_Base_ptr)&cVar9._M_node[2]._M_parent;
              p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
            local_100 = *(key_type *)(p_Var11 + 1);
            puVar10 = (uint *)std::
                              map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                              ::operator[](&this->TargetIndex,&local_100);
            local_124 = *puVar10;
            sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,
                               (key_type_conflict *)&local_124);
            if (sVar7 == 0) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_60,(int *)&local_124);
              local_114 = local_124;
              bVar1 = local_120->Cross;
              std::
              __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ::__shared_ptr(&local_d8,local_f8);
              uVar5 = local_f0._0_8_;
              local_f0.Strong = false;
              local_f0.Dest = local_114;
              local_f0._6_2_ = SUB82(uVar5,6);
              local_f0.Cross = bVar1;
              local_f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = local_d8._M_ptr;
              local_f0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = local_d8._M_refcount._M_pi;
              local_d8._M_ptr = (element_type *)0x0;
              local_d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
                        (local_108,&local_f0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_f0.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_d8._M_refcount);
            }
          }
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_98);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_90);
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void cmComputeTargetDepends::OptimizeLinkDependencies(
  cmGeneratorTarget const* gt, cmGraphEdgeList& outputEdges,
  cmGraphEdgeList const& inputEdges)
{
  std::set<int> emitted;
  for (auto const& edge : inputEdges) {
    if (edge.IsStrong()) {
      // Preserve strong edges
      outputEdges.push_back(edge);
    } else {
      auto const& dse = this->SideEffects[edge];

      // Add edges that have custom command side effects
      for (cmGeneratorTarget const* dep : dse.CustomCommandSideEffects) {
        auto index = this->TargetIndex[dep];
        if (!emitted.count(index)) {
          emitted.insert(index);
          outputEdges.push_back(
            cmGraphEdge(index, false, edge.IsCross(), edge.GetBacktrace()));
        }
      }

      // Add edges that have language side effects for languages we
      // care about
      for (auto const& lang : gt->GetAllConfigCompileLanguages()) {
        auto it = dse.LanguageSideEffects.find(lang);
        if (it != dse.LanguageSideEffects.end()) {
          for (cmGeneratorTarget const* dep : it->second) {
            auto index = this->TargetIndex[dep];
            if (!emitted.count(index)) {
              emitted.insert(index);
              outputEdges.push_back(cmGraphEdge(index, false, edge.IsCross(),
                                                edge.GetBacktrace()));
            }
          }
        }
      }
    }
  }
}